

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O2

void __thiscall
EventLoopThreadPool::EventLoopThreadPool
          (EventLoopThreadPool *this,EventLoop *baseLoop,int numThreads)

{
  Logger local_ff0;
  
  this->baseLoop_ = baseLoop;
  this->started_ = false;
  this->numThreads_ = numThreads;
  this->next_ = 0;
  (this->threads_).
  super__Vector_base<std::shared_ptr<EventLoopThread>,_std::allocator<std::shared_ptr<EventLoopThread>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).
  super__Vector_base<std::shared_ptr<EventLoopThread>,_std::allocator<std::shared_ptr<EventLoopThread>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads_).
  super__Vector_base<std::shared_ptr<EventLoopThread>,_std::allocator<std::shared_ptr<EventLoopThread>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->loops_).super__Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loops_).super__Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->loops_).super__Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < numThreads) {
    return;
  }
  Logger::Logger(&local_ff0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/EventLoopThreadPool.cpp"
                 ,6);
  LogStream::operator<<((LogStream *)&local_ff0,"numThreads<=0");
  Logger::~Logger(&local_ff0);
  abort();
}

Assistant:

EventLoopThreadPool::EventLoopThreadPool(EventLoop* baseLoop, int numThreads)
        :baseLoop_(baseLoop), started_(false), numThreads_(numThreads), next_(0) {
            if(numThreads_ <= 0){
                LOG<<"numThreads<=0";
                abort();
            }
}